

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O0

MultiFab * amrex::cast<amrex::MultiFab,amrex::iMultiFab>(iMultiFab *mf_in)

{
  bool bVar1;
  int iVar2;
  BoxArray *ngrow;
  FabArrayBase *fabarray_;
  long lVar3;
  double *pdVar4;
  int *piVar5;
  FabArrayBase *in_RSI;
  BaseFab<double> *in_RDI;
  Long i;
  int *psrc;
  double *pdst;
  Long n;
  MFIter mfi;
  MultiFab *mf_out;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffeb0;
  MFIter *this;
  BaseFab<double> *this_00;
  uchar flags_;
  undefined4 in_stack_fffffffffffffee0;
  BoxArray *bxs;
  MultiFab *in_stack_fffffffffffffef0;
  long lVar6;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff00;
  MFIter local_d0;
  undefined1 local_60 [16];
  int aiStack_50 [8];
  int local_30 [3];
  Vector<int,_std::allocator<int>_> *local_20;
  int local_18;
  undefined1 local_11;
  FabArrayBase *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  ngrow = FabArrayBase::boxArray(in_RSI);
  fabarray_ = (FabArrayBase *)FabArrayBase::DistributionMap(local_10);
  iVar2 = FabArrayBase::nComp(local_10);
  local_30 = (int  [3])FabArrayBase::nGrowVect(local_10);
  local_18 = local_30[2];
  local_20 = (Vector<int,_std::allocator<int>_> *)local_30._0_8_;
  aiStack_50._8_8_ = 0;
  aiStack_50[4] = 0;
  aiStack_50[5] = 0;
  local_60._8_8_ = (FabArrayBase *)0x0;
  aiStack_50[0] = 0;
  aiStack_50[1] = 0;
  aiStack_50[6] = 0;
  aiStack_50[7] = 0;
  bxs = (BoxArray *)(local_60 + 8);
  MFInfo::MFInfo((MFInfo *)0x12e029c);
  local_60._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi_00 = (MFIter *)local_60;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffeb0);
  this = mfi_00;
  MultiFab::MultiFab(in_stack_fffffffffffffef0,bxs,
                     (DistributionMapping *)CONCAT44(iVar2,in_stack_fffffffffffffee0),
                     (int)((ulong)fabarray_ >> 0x20),(IntVect *)ngrow,(MFInfo *)this_00,
                     in_stack_ffffffffffffff00);
  flags_ = (uchar)((ulong)ngrow >> 0x38);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x12e02f9);
  MFInfo::~MFInfo((MFInfo *)0x12e0306);
  MFIter::MFIter((MFIter *)CONCAT44(iVar2,in_stack_fffffffffffffee0),fabarray_,flags_);
  while (bVar1 = MFIter::isValid(&local_d0), bVar1) {
    MFIter::fabbox(this);
    in_stack_fffffffffffffeb0 = (FabArray<amrex::FArrayBox> *)Box::numPts((Box *)this);
    iVar2 = FabArrayBase::nComp(local_10);
    lVar3 = (long)in_stack_fffffffffffffeb0 * (long)iVar2;
    FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffffeb0,mfi_00);
    pdVar4 = BaseFab<double>::dataPtr(this_00,(int)((ulong)this >> 0x20));
    FabArray<amrex::IArrayBox>::operator[]
              ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffeb0,mfi_00);
    piVar5 = BaseFab<int>::dataPtr((BaseFab<int> *)this_00,(int)((ulong)this >> 0x20));
    for (lVar6 = 0; lVar6 < lVar3; lVar6 = lVar6 + 1) {
      pdVar4[lVar6] = (double)piVar5[lVar6];
    }
    MFIter::operator++(&local_d0);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffeb0);
  return (MultiFab *)in_RDI;
}

Assistant:

T cast (U const& mf_in)
    {
        T mf_out(mf_in.boxArray(), mf_in.DistributionMap(), mf_in.nComp(), mf_in.nGrowVect());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf_in); mfi.isValid(); ++mfi)
        {
            const Long n = mfi.fabbox().numPts() * mf_in.nComp();
            auto pdst = mf_out[mfi].dataPtr();
            auto psrc = mf_in [mfi].dataPtr();
            AMREX_HOST_DEVICE_PARALLEL_FOR_1D ( n, i,
            {
                pdst[i] = static_cast<typename U::value_type>(psrc[i]);
            });
        }
        return mf_out;
    }